

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *__s;
  char *__s_00;
  char *__s_01;
  char *__s_02;
  char *__lhs;
  pointer prVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  ulong uVar8;
  int x;
  int iVar9;
  long lVar10;
  long lVar11;
  Image *src;
  ulong uVar12;
  int iVar13;
  long lVar14;
  uchar *puVar15;
  Image map_image;
  vector<Image,_std::allocator<Image>_> tile_images;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> out_filename;
  vector<room_t,_std::allocator<room_t>_> rooms;
  vector<monster_t,_std::allocator<monster_t>_> monster_data;
  vector<Image,_std::allocator<Image>_> monster_mask_images;
  vector<Image,_std::allocator<Image>_> monster_images;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (argc < 7) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar7 = std::operator<<(poVar7,*argv);
    std::operator<<(poVar7," egapics.pic pymon.pic pymask.pic pymon.dat in.rms prefix\n");
    iVar6 = 1;
  }
  else {
    __s = argv[2];
    __s_00 = argv[3];
    __s_01 = argv[4];
    __s_02 = argv[5];
    __lhs = argv[6];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&map_image,argv[1],(allocator<char> *)&out_filename);
    LoadSpritesheet(&tile_images,(string *)&map_image);
    std::__cxx11::string::~string((string *)&map_image);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&map_image,__s,(allocator<char> *)&out_filename);
    LoadSpritesheet(&monster_images,(string *)&map_image);
    std::__cxx11::string::~string((string *)&map_image);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&map_image,__s_00,(allocator<char> *)&out_filename);
    LoadSpritesheet(&monster_mask_images,(string *)&map_image);
    std::__cxx11::string::~string((string *)&map_image);
    iVar6 = (tile_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
             super__Vector_impl_data._M_start)->width_;
    iVar1 = (tile_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
             super__Vector_impl_data._M_start)->height_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&map_image,__s_02,(allocator<char> *)&out_filename);
    LoadRooms(&rooms,(string *)&map_image);
    std::__cxx11::string::~string((string *)&map_image);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&map_image,__s_01,(allocator<char> *)&out_filename);
    LoadMonsterData(&monster_data,(string *)&map_image);
    std::__cxx11::string::~string((string *)&map_image);
    lVar10 = 0xa0;
    for (uVar12 = 0;
        prVar2 = rooms.super__Vector_base<room_t,_std::allocator<room_t>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar12 < (ulong)(((long)rooms.super__Vector_base<room_t,_std::allocator<room_t>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)rooms.super__Vector_base<room_t,_std::allocator<room_t>_>._M_impl.
                               super__Vector_impl_data._M_start) / 0x149); uVar12 = uVar12 + 1) {
      Image::Image(&map_image,iVar6 * 0x14,iVar1 << 3);
      puVar15 = (prVar2->tiles)._M_elems + lVar10;
      for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
        for (lVar11 = 0; lVar11 != 0x14; lVar11 = lVar11 + 1) {
          if (puVar15[lVar11 + -0xa0] != '\0') {
            bVar3 = puVar15[lVar11 + -0xa0] - 1;
            uVar4 = (uint)bVar3;
            if ((ulong)((long)tile_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)tile_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                              super__Vector_impl_data._M_start >> 5) <= (ulong)bVar3) {
              uVar4 = 0x14;
            }
            uVar8 = (ulong)(uVar4 << 5);
            iVar9 = (int)lVar11;
            iVar13 = (int)lVar14;
            Image::Blit(&map_image,
                        (Image *)((long)&(tile_images.
                                          super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                                          super__Vector_impl_data._M_start)->width_ + uVar8),
                        *(int *)((long)&(tile_images.
                                         super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                                         super__Vector_impl_data._M_start)->width_ + uVar8) * iVar9,
                        *(int *)((long)&(tile_images.
                                         super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                                         super__Vector_impl_data._M_start)->height_ + uVar8) *
                        iVar13);
            bVar3 = puVar15[lVar11];
            if (bVar3 != 0) {
              if (bVar3 < 100) {
                uVar8 = (ulong)monster_data.
                               super__Vector_base<monster_t,_std::allocator<monster_t>_>._M_impl.
                               super__Vector_impl_data._M_start
                               [(ulong)prVar2[uVar12].monster_id - 1].gfx;
                Image::Blit(&map_image,
                            monster_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl
                            .super__Vector_impl_data._M_start + (uVar8 - 1),
                            monster_mask_images.super__Vector_base<Image,_std::allocator<Image>_>.
                            _M_impl.super__Vector_impl_data._M_start + (uVar8 - 1),
                            monster_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl
                            .super__Vector_impl_data._M_start[uVar8 - 1].width_ * iVar9,
                            monster_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl
                            .super__Vector_impl_data._M_start[uVar8 - 1].height_ * iVar13);
              }
              else {
                uVar4 = GetObjectTile(bVar3);
                iVar5 = GetObjectTileMask(bVar3);
                src = (Image *)((long)&(tile_images.
                                        super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                                        super__Vector_impl_data._M_start)->width_ +
                               (ulong)((uVar4 & 0xff) << 5));
                if (iVar5 == 0) {
                  Image::Blit(&map_image,src,src->width_ * iVar9,src->height_ * iVar13);
                }
                else {
                  Image::Blit(&map_image,src,
                              tile_images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                              super__Vector_impl_data._M_start + iVar5,src->width_ * iVar9,
                              src->height_ * iVar13);
                }
              }
            }
          }
        }
        puVar15 = puVar15 + 0x14;
      }
      std::__cxx11::to_string(&local_70,(int)uVar12);
      std::operator+(&local_50,__lhs,&local_70);
      std::operator+(&out_filename,&local_50,".png");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      stbi_write_png(out_filename._M_dataplus._M_p,map_image.width_,map_image.height_,3,
                     map_image.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl
                     .super__Vector_impl_data._M_start,map_image.width_ * 3);
      std::__cxx11::string::~string((string *)&out_filename);
      std::_Vector_base<color_t,_std::allocator<color_t>_>::~_Vector_base
                (&map_image.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>);
      lVar10 = lVar10 + 0x149;
    }
    std::_Vector_base<monster_t,_std::allocator<monster_t>_>::~_Vector_base
              (&monster_data.super__Vector_base<monster_t,_std::allocator<monster_t>_>);
    std::_Vector_base<room_t,_std::allocator<room_t>_>::~_Vector_base
              (&rooms.super__Vector_base<room_t,_std::allocator<room_t>_>);
    std::vector<Image,_std::allocator<Image>_>::~vector(&monster_mask_images);
    std::vector<Image,_std::allocator<Image>_>::~vector(&monster_images);
    std::vector<Image,_std::allocator<Image>_>::~vector(&tile_images);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int main(int argc, char** argv) {
  if (argc < 7) {
    std::cerr << "Usage: " << argv[0]
              << " egapics.pic pymon.pic pymask.pic pymon.dat in.rms prefix\n";
    return 1;
  }

  auto const egapics_filename = argv[1];
  auto const pymon_filename = argv[2];
  auto const pymask_filename = argv[3];
  auto const pymon_dat_filename = argv[4];
  auto const rms_filename = argv[5];
  auto const out_prefix = argv[6];

  auto const tile_images = LoadSpritesheet(egapics_filename);
  auto const monster_images = LoadSpritesheet(pymon_filename);
  auto const monster_mask_images = LoadSpritesheet(pymask_filename);
  auto const tile_width = tile_images[0].GetWidth();
  auto const tile_height = tile_images[0].GetHeight();

  auto const rooms = LoadRooms(rms_filename);
  auto const monster_data = LoadMonsterData(pymon_dat_filename);

  for (auto room_index = 0; room_index < rooms.size(); ++room_index) {
    auto const& room = rooms[room_index];
    Image map_image(tile_width * kRoomWidth, tile_height * kRoomHeight);

    // TODO: Cheaters versions of the maps
    // Make glass walls visible
    // No magical darkness
    // Highlight important traps
    // Reveal soft walls and secret doors
    // No fog
    // Easier to see Quasits

    for (auto y = 0; y < kRoomHeight; ++y) {
      for (auto x = 0; x < kRoomWidth; ++x) {
        // FIRST do tile
        auto tile = room.tiles[y * kRoomWidth + x];

        // 0 is null, nothing here
        if (tile == 0) {
          continue;
        }
        tile -= 1;

        // TODO: There are many kinds of traps (wands, XP) but they're stored as
        // ASCII chars. Figure them out
        if (tile >= tile_images.size()) {
          tile = 20;
        }

        auto const& tile_img = tile_images[tile];
        map_image.Blit(tile_img, x * tile_img.GetWidth(),
                       y * tile_img.GetHeight());

        // SECOND do object
        auto object = room.objects[y * kRoomWidth + x];

        // 0 is null, nothing here
        if (object == 0) {
          continue;
        }

        // Monsters (with mask)
        if (object <= 'c') {
          auto const monster_index = room.monster_id - 1;
          auto const monster_gfx = monster_data[monster_index].gfx - 1;
          auto const& monster_img = monster_images[monster_gfx];
          auto const& mask_img = monster_mask_images[monster_gfx];
          map_image.Blit(monster_img, mask_img, x * monster_img.GetWidth(),
                         y * monster_img.GetHeight());
          continue;
        }

        tile = GetObjectTile(object);
        auto mask = GetObjectTileMask(object);

        // Tiles no mask
        if (mask == 0) {
          auto const& obj_img = tile_images[tile];
          map_image.Blit(obj_img, x * obj_img.GetWidth(),
                         y * obj_img.GetHeight());
          continue;
        }

        // Tiles with mask
        auto const& obj_img = tile_images[tile];
        auto const& mask_img = tile_images[mask];
        map_image.Blit(obj_img, mask_img, x * obj_img.GetWidth(),
                       y * obj_img.GetHeight());
      }
    }

    // XXX: I'm relying on color_t to serialize properly without
    // intervention which may not be the case on non-x86 platforms
    auto const out_filename = out_prefix + std::to_string(room_index) + ".png";
    stbi_write_png(out_filename.c_str(), map_image.GetWidth(),
                   map_image.GetHeight(), kImageComponents,
                   map_image.GetData().data(),
                   map_image.GetWidth() * kImageComponents);
  }

  return 0;
}